

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_append(char *args)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *__s;
  
  __s = args;
  if (*args == '\"') {
    __s = args + 1;
    sVar2 = strlen(__s);
    args[sVar2] = '\0';
  }
  lVar3 = PHYSFS_openAppend(__s);
  if (lVar3 != 0) {
    if ((do_buffer_size == 0) || (iVar1 = PHYSFS_setBuffer(lVar3), iVar1 != 0)) {
      uVar4 = PHYSFS_writeBytes(lVar3,"The cat sat on the mat.\n\n",0x19);
      if (uVar4 == 0x19) {
        puts("Successful.");
      }
      else {
        uVar5 = PHYSFS_getLastError();
        printf("Wrote (%d) of (%d) bytes. Reason: [%s].\n",uVar4 & 0xffffffff,0x19,uVar5);
      }
    }
    else {
      uVar5 = PHYSFS_getLastError();
      printf("failed to set file buffer. Reason: [%s].\n",uVar5);
    }
    PHYSFS_close(lVar3);
    return 1;
  }
  uVar5 = PHYSFS_getLastError();
  printf("failed to open. Reason: [%s].\n",uVar5);
  return 1;
}

Assistant:

static int cmd_append(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openAppend(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        size_t bw;
        PHYSFS_sint64 rc;

        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f, do_buffer_size))
            {
                printf("failed to set file buffer. Reason: [%s].\n",
                        PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */
        } /* if */

        bw = strlen(WRITESTR);
        rc = PHYSFS_writeBytes(f, WRITESTR, bw);
        if (rc != bw)
        {
            printf("Wrote (%d) of (%d) bytes. Reason: [%s].\n",
                   (int) rc, (int) bw, PHYSFS_getLastError());
        } /* if */
        else
        {
            printf("Successful.\n");
        } /* else */

        PHYSFS_close(f);
    } /* else */

    return 1;
}